

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# internal_dwa_compressor.h
# Opt level: O0

exr_result_t DwaCompressor_initializeBuffers(DwaCompressor *me,size_t *bufferSize)

{
  long lVar1;
  long lVar2;
  exr_result_t eVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  uint64_t uVar7;
  size_t sVar8;
  size_t sVar9;
  size_t sVar10;
  ulong uVar11;
  undefined8 uVar12;
  long *in_RSI;
  size_t in_RDI;
  float fVar13;
  float fVar14;
  int i_2;
  exr_coding_channel_info_t *curc;
  int c;
  size_t i_1;
  int i;
  uint64_t planarUncBufferSize [3];
  uint64_t pixelCount;
  uint64_t maxLossyDctDcSize;
  uint64_t maxLossyDctAcSize;
  uint64_t rleBufferSize;
  uint64_t unknownBufferSize;
  uint64_t numLossyDctChans;
  uint64_t maxOutBufferSize;
  exr_result_t rv;
  size_t in_bytes;
  int local_9c;
  int local_8c;
  ulong local_88;
  int local_7c;
  DwaCompressor *in_stack_ffffffffffffff88;
  ulong local_40;
  long local_30;
  long local_28;
  
  local_28 = 0;
  local_30 = 0;
  local_40 = 0;
  fVar13 = ceilf((float)*(int *)(in_RDI + 0x14) * 0.125);
  fVar14 = ceilf((float)((*(int *)(in_RDI + 0x20) - *(int *)(in_RDI + 0x18)) + 1) * 0.125);
  lVar4 = ((long)fVar13 | (long)(fVar13 - 9.223372e+18) & (long)fVar13 >> 0x3f) *
          ((long)fVar14 | (long)(fVar14 - 9.223372e+18) & (long)fVar14 >> 0x3f);
  lVar2 = lVar4 * 0x7e;
  in_bytes = in_RDI;
  fVar13 = ceilf((float)*(int *)(in_RDI + 0x14) * 0.125);
  fVar14 = ceilf((float)((*(int *)(in_bytes + 0x20) - *(int *)(in_bytes + 0x18)) + 1) * 0.125);
  lVar5 = ((long)fVar13 | (long)(fVar13 - 9.223372e+18) & (long)fVar13 >> 0x3f) *
          ((long)fVar14 | (long)(fVar14 - 9.223372e+18) & (long)fVar14 >> 0x3f) * 2;
  lVar6 = (long)*(int *)(in_RDI + 0x14) *
          (long)((*(int *)(in_RDI + 0x20) - *(int *)(in_RDI + 0x18)) + 1);
  for (local_7c = 0; local_7c < 3; local_7c = local_7c + 1) {
    *(undefined8 *)(&stack0xffffffffffffff88 + (long)local_7c * 8) = 0;
  }
  for (local_88 = 0; local_88 < *(ulong *)(in_RDI + 0x50); local_88 = local_88 + 1) {
    uVar7 = Classifier_size((Classifier *)0x3f40e8);
    local_28 = uVar7 + local_28;
  }
  eVar3 = DwaCompressor_classifyChannels(in_stack_ffffffffffffff88);
  if (eVar3 == 0) {
    for (local_8c = 0; local_8c < *(int *)(in_RDI + 0x28); local_8c = local_8c + 1) {
      lVar1 = *(long *)(*(long *)(in_RDI + 0x30) + 0x1c0 + (long)local_8c * 0x240);
      switch(*(undefined4 *)(*(long *)(in_RDI + 0x30) + 0x224 + (long)local_8c * 0x240)) {
      case 0:
        in_stack_ffffffffffffff88 =
             (DwaCompressor *)
             ((long)in_stack_ffffffffffffff88->_min + lVar6 * *(char *)(lVar1 + 0x19) + -0x18);
        break;
      case 1:
        sVar8 = exr_compress_max_buffer_size(in_bytes);
        sVar8 = std_max(lVar4 * 0xfc + 0x10000,sVar8);
        local_28 = sVar8 + local_28;
        local_30 = local_30 + 1;
        break;
      case 2:
        local_40 = lVar6 * 2 * (long)*(char *)(lVar1 + 0x19) + local_40;
        break;
      case 3:
      default:
        return 3;
      }
    }
    sVar8 = exr_compress_max_buffer_size(in_bytes);
    sVar9 = exr_compress_max_buffer_size(in_bytes);
    sVar10 = exr_compress_max_buffer_size(in_bytes);
    *in_RSI = sVar10 + sVar9 + sVar8 + local_28 + 0x58;
    uVar11 = lVar2 * local_30;
    if (*(ulong *)(in_RDI + 0x60) <= uVar11 && uVar11 - *(ulong *)(in_RDI + 0x60) != 0) {
      *(long *)(in_RDI + 0x60) = lVar2 * local_30;
      if (*(long *)(in_RDI + 0x58) != 0) {
        (**(code **)(in_RDI + 0xc0))(*(undefined8 *)(in_RDI + 0x58));
      }
      uVar12 = (**(code **)(in_RDI + 0xb8))(*(undefined8 *)(in_RDI + 0x60));
      *(undefined8 *)(in_RDI + 0x58) = uVar12;
      if (*(long *)(in_RDI + 0x58) == 0) {
        return 1;
      }
      memset(*(void **)(in_RDI + 0x58),0,*(size_t *)(in_RDI + 0x60));
    }
    uVar11 = lVar5 * local_30;
    if (*(ulong *)(in_RDI + 0x70) <= uVar11 && uVar11 - *(ulong *)(in_RDI + 0x70) != 0) {
      *(long *)(in_RDI + 0x70) = lVar5 * local_30;
      if (*(long *)(in_RDI + 0x68) != 0) {
        (**(code **)(in_RDI + 0xc0))(*(undefined8 *)(in_RDI + 0x68));
      }
      uVar12 = (**(code **)(in_RDI + 0xb8))(*(undefined8 *)(in_RDI + 0x70));
      *(undefined8 *)(in_RDI + 0x68) = uVar12;
      if (*(long *)(in_RDI + 0x68) == 0) {
        return 1;
      }
      memset(*(void **)(in_RDI + 0x68),0,*(size_t *)(in_RDI + 0x70));
    }
    if (*(ulong *)(in_RDI + 0x80) < local_40) {
      *(ulong *)(in_RDI + 0x80) = local_40;
      if (*(long *)(in_RDI + 0x78) != 0) {
        (**(code **)(in_RDI + 0xc0))(*(undefined8 *)(in_RDI + 0x78));
      }
      uVar12 = (**(code **)(in_RDI + 0xb8))(local_40);
      *(undefined8 *)(in_RDI + 0x78) = uVar12;
      if (*(long *)(in_RDI + 0x78) == 0) {
        return 1;
      }
      memset(*(void **)(in_RDI + 0x78),0,local_40);
    }
    if (in_stack_ffffffffffffff88 != (DwaCompressor *)0x0) {
      exr_compress_max_buffer_size(in_bytes);
    }
    for (local_9c = 0; local_9c < 3; local_9c = local_9c + 1) {
      if (*(ulong *)(in_RDI + 0xa0 + (long)local_9c * 8) <
          *(ulong *)(&stack0xffffffffffffff88 + (long)local_9c * 8)) {
        *(undefined8 *)(in_RDI + 0xa0 + (long)local_9c * 8) =
             *(undefined8 *)(&stack0xffffffffffffff88 + (long)local_9c * 8);
        if (*(long *)(in_RDI + 0x88 + (long)local_9c * 8) != 0) {
          (**(code **)(in_RDI + 0xc0))(*(undefined8 *)(in_RDI + 0x88 + (long)local_9c * 8));
        }
        uVar12 = (**(code **)(in_RDI + 0xb8))
                           (*(undefined8 *)(&stack0xffffffffffffff88 + (long)local_9c * 8));
        *(undefined8 *)(in_RDI + 0x88 + (long)local_9c * 8) = uVar12;
        if (*(long *)(in_RDI + 0x88 + (long)local_9c * 8) == 0) {
          return 1;
        }
      }
    }
  }
  return eVar3;
}

Assistant:

exr_result_t
DwaCompressor_initializeBuffers (DwaCompressor* me, size_t* bufferSize)
{
    exr_result_t rv = EXR_ERR_SUCCESS;

    //
    // _outBuffer needs to be big enough to hold all our
    // compressed data - which could vary depending on what sort
    // of channels we have.
    //

    uint64_t maxOutBufferSize  = 0;
    uint64_t numLossyDctChans  = 0;
    uint64_t unknownBufferSize = 0;
    uint64_t rleBufferSize     = 0;

    uint64_t maxLossyDctAcSize =
        (uint64_t) (ceilf ((float) me->_numScanLines / 8.0f)) *
        (uint64_t) (ceilf ((float) (me->_max[0] - me->_min[0] + 1) / 8.0f)) *
        63 * sizeof (uint16_t);

    uint64_t maxLossyDctDcSize =
        (uint64_t) (ceilf ((float) me->_numScanLines / 8.0f)) *
        (uint64_t) (ceilf ((float) (me->_max[0] - me->_min[0] + 1) / 8.0f)) *
        sizeof (uint16_t);

    uint64_t pixelCount = (uint64_t) (me->_numScanLines) *
                          (uint64_t) (me->_max[0] - me->_min[0] + 1);

    uint64_t planarUncBufferSize[NUM_COMPRESSOR_SCHEMES];

    for (int i = 0; i < NUM_COMPRESSOR_SCHEMES; ++i)
        planarUncBufferSize[i] = 0;

    for (size_t i = 0; i < me->_channelRuleCount; ++i)
    {
        maxOutBufferSize += Classifier_size (&(me->_channelRules[i]));
    }

    rv = DwaCompressor_classifyChannels (me);
    if (rv != EXR_ERR_SUCCESS) return rv;

    for (int c = 0; c < me->_numChannels; ++c)
    {
        const exr_coding_channel_info_t* curc = me->_channelData[c].chan;
        switch (me->_channelData[c].compression)
        {
            case LOSSY_DCT:

                //
                // This is the size of the number of packed
                // components, plus the requirements for
                // maximum Huffman encoding size (for STATIC_HUFFMAN)
                // or for zlib compression (for DEFLATE)
                //

                maxOutBufferSize += std_max (
                    2lu * maxLossyDctAcSize + 65536lu,
                    exr_compress_max_buffer_size (maxLossyDctAcSize));
                numLossyDctChans++;
                break;

            case RLE:
                //
                // RLE, if gone horribly wrong, could double the size
                // of the source data.
                //
                rleBufferSize +=
                    2 * pixelCount * (uint64_t) curc->bytes_per_element;

                planarUncBufferSize[RLE] +=
                    2 * pixelCount * (uint64_t) curc->bytes_per_element;
                break;

            case UNKNOWN:
                unknownBufferSize +=
                    pixelCount * (uint64_t) curc->bytes_per_element;
                planarUncBufferSize[UNKNOWN] +=
                    pixelCount * (uint64_t) curc->bytes_per_element;
                break;

            case NUM_COMPRESSOR_SCHEMES:
            default: return EXR_ERR_INVALID_ARGUMENT;
        }
    }

    //
    // Also, since the results of the RLE are packed into
    // the output buffer, we need the extra room there. But
    // we're going to zlib compress() the data we pack,
    // which could take slightly more space
    //

    maxOutBufferSize += exr_compress_max_buffer_size (rleBufferSize);

    //
    // And the same goes for the UNKNOWN data
    //

    maxOutBufferSize += exr_compress_max_buffer_size (unknownBufferSize);

    //
    // Reserve space big enough to hold the DC data
    // and include its compressed results in the size requirements
    // for our output buffer
    //

    maxOutBufferSize +=
        exr_compress_max_buffer_size (maxLossyDctDcSize * numLossyDctChans);

    //
    // We also need to reserve space at the head of the buffer to
    // write out the size of our various packed and compressed data.
    //

    maxOutBufferSize += NUM_SIZES_SINGLE * sizeof (uint64_t);

    //
    // Later, we're going to hijack outBuffer for the result of
    // both encoding and decoding. So it needs to be big enough
    // to hold either a buffers' worth of uncompressed or
    // compressed data
    //
    // For encoding, we'll need _outBuffer to hold maxOutBufferSize bytes,
    // but for decoding, we only need it to be maxScanLineSize*numScanLines.
    // Cache the max size for now, and alloc the buffer when we either
    // encode or decode.
    //

    *bufferSize = maxOutBufferSize;

    //
    // _packedAcBuffer holds the quantized DCT coefficients prior
    // to Huffman encoding
    //

    if (maxLossyDctAcSize * numLossyDctChans > me->_packedAcBufferSize)
    {
        me->_packedAcBufferSize = maxLossyDctAcSize * numLossyDctChans;
        if (me->_packedAcBuffer != NULL) me->free_fn (me->_packedAcBuffer);
        me->_packedAcBuffer = me->alloc_fn (me->_packedAcBufferSize);
        if (!me->_packedAcBuffer) return EXR_ERR_OUT_OF_MEMORY;
        memset (me->_packedAcBuffer, 0, me->_packedAcBufferSize);
    }

    //
    // _packedDcBuffer holds one quantized DCT coef per 8x8 block
    //

    if (maxLossyDctDcSize * numLossyDctChans > me->_packedDcBufferSize)
    {
        me->_packedDcBufferSize = maxLossyDctDcSize * numLossyDctChans;
        if (me->_packedDcBuffer != NULL) me->free_fn (me->_packedDcBuffer);
        me->_packedDcBuffer = me->alloc_fn (me->_packedDcBufferSize);
        if (!me->_packedDcBuffer) return EXR_ERR_OUT_OF_MEMORY;
        memset (me->_packedDcBuffer, 0, me->_packedDcBufferSize);
    }

    if (rleBufferSize > me->_rleBufferSize)
    {
        me->_rleBufferSize = rleBufferSize;
        if (me->_rleBuffer != 0) me->free_fn (me->_rleBuffer);
        me->_rleBuffer = me->alloc_fn (rleBufferSize);
        if (!me->_rleBuffer) return EXR_ERR_OUT_OF_MEMORY;
        memset (me->_rleBuffer, 0, rleBufferSize);
    }

    //
    // The planar uncompressed buffer will hold float data for LOSSY_DCT
    // compressed values, and whatever the native type is for other
    // channels. We're going to use this to hold data in a planar
    // format, as opposed to the native interleaved format we take
    // into compress() and give back from uncompress().
    //
    // This also makes it easier to compress the UNKNOWN and RLE data
    // all in one swoop (for each compression scheme).
    //

    //
    // UNKNOWN data is going to be zlib compressed, which needs
    // a little extra headroom
    //

    if (planarUncBufferSize[UNKNOWN] > 0)
    {
        planarUncBufferSize[UNKNOWN] =
            exr_compress_max_buffer_size (planarUncBufferSize[UNKNOWN]);
    }

    for (int i = 0; i < NUM_COMPRESSOR_SCHEMES; ++i)
    {
        if (planarUncBufferSize[i] > me->_planarUncBufferSize[i])
        {
            me->_planarUncBufferSize[i] = planarUncBufferSize[i];
            if (me->_planarUncBuffer[i] != NULL)
                me->free_fn (me->_planarUncBuffer[i]);

            if (planarUncBufferSize[i] > SIZE_MAX)
            {
                return EXR_ERR_OUT_OF_MEMORY;
            }

            me->_planarUncBuffer[i] = me->alloc_fn (planarUncBufferSize[i]);
            if (!me->_planarUncBuffer[i]) return EXR_ERR_OUT_OF_MEMORY;
        }
    }

    return rv;
}